

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void drft_forward(drft_lookup *l,float *data)

{
  uint uVar1;
  uint uVar2;
  int ip;
  float *cc;
  int *piVar3;
  uint l1;
  int ido;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  
  uVar1 = l->n;
  lVar9 = (long)(int)uVar1;
  if (lVar9 != 1) {
    cc = l->trigcache;
    piVar3 = l->splitcache;
    uVar2 = piVar3[1];
    lVar10 = 0;
    uVar5 = 0;
    if (0 < (int)uVar2) {
      uVar5 = (ulong)uVar2;
    }
    uVar8 = 1;
    uVar11 = uVar1;
    uVar7 = uVar1;
    for (; -uVar5 != lVar10; lVar10 = lVar10 + -1) {
      ip = piVar3[(long)(int)uVar2 + lVar10 + 1];
      l1 = (int)uVar7 / ip;
      ido = (int)uVar1 / (int)uVar7;
      uVar11 = uVar11 - (ip + -1) * ido;
      lVar6 = (long)(int)uVar11;
      if (ip == 2) {
        if (uVar8 == 1) {
          dradf2(ido,l1,data,cc,cc + lVar9 + lVar6 + -1);
          goto LAB_001bc637;
        }
        dradf2(ido,l1,cc,data,cc + lVar9 + lVar6 + -1);
LAB_001bc6a1:
        uVar8 = 1;
      }
      else if (ip == 4) {
        if (uVar8 != 1) {
          dradf4(ido,l1,cc,data,cc + lVar9 + lVar6 + -1,cc + lVar9 + (long)(int)(uVar11 + ido) + -1,
                 cc + lVar9 + (long)(int)(ido + uVar11 + ido) + -1);
          goto LAB_001bc6a1;
        }
        dradf4(ido,l1,data,cc,cc + lVar9 + lVar6 + -1,cc + lVar9 + (long)(int)(uVar11 + ido) + -1,
               cc + lVar9 + (long)(int)(ido + uVar11 + ido) + -1);
LAB_001bc637:
        uVar8 = 0;
      }
      else {
        uVar7 = 1 - uVar8;
        if (ido == 1) {
          uVar7 = uVar8;
        }
        if (uVar7 == 0) {
          dradfg(ido,ip,l1,l1 * ido,data,data,data,cc,cc,cc + lVar9 + lVar6 + -1);
        }
        else {
          dradfg(ido,ip,l1,l1 * ido,cc,cc,cc,data,data,cc + lVar9 + lVar6 + -1);
        }
        uVar8 = (uint)(uVar7 == 0);
      }
      uVar7 = l1;
    }
    if (uVar8 != 1) {
      uVar5 = 0;
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        data[uVar5] = cc[uVar5];
      }
    }
  }
  return;
}

Assistant:

void drft_forward(drft_lookup *l,float *data){
  if(l->n==1)return;
  drftf1(l->n,data,l->trigcache,l->trigcache+l->n,l->splitcache);
}